

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

int __thiscall BigInt::get_real_length(BigInt *this)

{
  size_type sVar1;
  reference pvVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  const_iterator local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  const_iterator local_20;
  int local_18;
  int local_14;
  int j;
  int i;
  BigInt *this_local;
  
  _j = this;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->value);
  local_14 = (int)sVar1;
  local_18 = 0;
  this->real_length = 0;
  while( true ) {
    local_14 = local_14 + -1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->value,(long)local_14);
    if (*pvVar2 != 0 || local_14 < 2) break;
    local_18 = local_18 + 1;
  }
  local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&this->value);
  local_28 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                       (&local_30,(long)local_18);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_20,
             &local_28);
  local_40._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&this->value);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_38,
             &local_40);
  std::vector<int,_std::allocator<int>_>::erase(&this->value,local_20,local_38);
  for (; 0 < local_14; local_14 = local_14 + -1) {
    this->real_length = this->real_length + 1;
  }
  return this->real_length;
}

Assistant:

int BigInt::get_real_length() {
    /*
     * not include the sign bit
     */
    int i = this->value.size() - 1;
    int j = 0;
    this->real_length = 0;
    while (this->value[i] == 0 && i > 1) {
        --i;
        ++j;
    }
    this->value.erase(this->value.end() - j, this->value.end());
    while (i > 0) {
        ++this->real_length;
        --i;
    }
    return this->real_length;
}